

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<Fad<double>>::Fad<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *fadexpr)

{
  int iVar1;
  int csize;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  value_type local_50;
  
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
            ((value_type *)(this + 8),&fadexpr->fadexpr_);
  iVar1 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  csize = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if (csize < iVar1) {
    csize = iVar1;
  }
  Vector<Fad<double>_>::Vector((Vector<Fad<double>_> *)(this + 0x28),csize);
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  uVar2 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar6 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar6;
    }
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx
                (&local_50,&fadexpr->fadexpr_,(int)uVar5);
      Fad<double>::operator=((Fad<double> *)(*(long *)(this + 0x30) + uVar6),&local_50);
      Fad<double>::~Fad(&local_50);
      uVar6 = uVar6 + 0x20;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }